

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

int emit_indexed_block(nghttp2_bufs *bufs,size_t idx)

{
  size_t len;
  uint8_t *bufp;
  uint8_t sb [16];
  size_t blocklen;
  int rv;
  size_t idx_local;
  nghttp2_bufs *bufs_local;
  
  len = count_encoded_length(idx + 1,7);
  if (len < 0x11) {
    bufp._0_1_ = 0x80;
    encode_length((uint8_t *)&bufp,idx + 1,7);
    bufs_local._4_4_ = nghttp2_bufs_add(bufs,&bufp,len);
    if (bufs_local._4_4_ == 0) {
      bufs_local._4_4_ = 0;
    }
  }
  else {
    bufs_local._4_4_ = -0x20b;
  }
  return bufs_local._4_4_;
}

Assistant:

static int emit_indexed_block(nghttp2_bufs *bufs, size_t idx) {
  int rv;
  size_t blocklen;
  uint8_t sb[16];
  uint8_t *bufp;

  blocklen = count_encoded_length(idx + 1, 7);

  DEBUGF("deflatehd: emit indexed index=%zu, %zu bytes\n", idx, blocklen);

  if (sizeof(sb) < blocklen) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  bufp = sb;
  *bufp = 0x80u;
  encode_length(bufp, idx + 1, 7);

  rv = nghttp2_bufs_add(bufs, sb, blocklen);
  if (rv != 0) {
    return rv;
  }

  return 0;
}